

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.c
# Opt level: O2

char * vrna_md_option_string(vrna_md_t *md)

{
  double dVar1;
  uint uVar2;
  size_t sVar3;
  
  vrna_md_option_string::options[0] = '\0';
  if (md != (vrna_md_t *)0x0) {
    uVar2 = md->dangles;
    if (uVar2 != 2) {
      sVar3 = strlen(vrna_md_option_string::options);
      sprintf(vrna_md_option_string::options + sVar3,"-d%d ",(ulong)uVar2);
    }
    if (md->special_hp == 0) {
      sVar3 = strlen(vrna_md_option_string::options);
      builtin_strncpy(vrna_md_option_string::options + sVar3,"-4 ",4);
    }
    if (md->noLP != 0) {
      sVar3 = strlen(vrna_md_option_string::options);
      builtin_strncpy(vrna_md_option_string::options + sVar3,"--noLP ",8);
    }
    if (md->noGU != 0) {
      sVar3 = strlen(vrna_md_option_string::options);
      builtin_strncpy(vrna_md_option_string::options + sVar3,"--noGU ",8);
    }
    if (md->noGUclosure != 0) {
      sVar3 = strlen(vrna_md_option_string::options);
      builtin_strncpy(vrna_md_option_string::options + sVar3,"--noClos",8);
      builtin_strncpy(vrna_md_option_string::options + sVar3 + 7,"singGU ",8);
    }
    dVar1 = md->temperature;
    if ((dVar1 != 37.0) || (NAN(dVar1))) {
      sVar3 = strlen(vrna_md_option_string::options);
      sprintf(vrna_md_option_string::options + sVar3,"-T %f ",dVar1);
    }
  }
  return vrna_md_option_string::options;
}

Assistant:

PUBLIC char *
vrna_md_option_string(vrna_md_t *md)
{
  static char options[255];

  *options = '\0';

  if (md) {
    if (md->dangles != VRNA_MODEL_DEFAULT_DANGLES)
      sprintf(options + strlen(options), "-d%d ", md->dangles);

    if (!md->special_hp)
      strcat(options, "-4 ");

    if (md->noLP)
      strcat(options, "--noLP ");

    if (md->noGU)
      strcat(options, "--noGU ");

    if (md->noGUclosure)
      strcat(options, "--noClosingGU ");

    if (md->temperature != VRNA_MODEL_DEFAULT_TEMPERATURE)
      sprintf(options + strlen(options), "-T %f ", md->temperature);
  }

  return options;
}